

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O2

_Bool py_attack_real(player *p,loc grid,_Bool *fear)

{
  bitflag *flags;
  short sVar1;
  uint uVar2;
  monster_race *pmVar3;
  bool bVar4;
  bool bVar5;
  unarmed_blow *puVar6;
  _Bool _Var7;
  byte bVar8;
  _Bool _Var9;
  _Bool _Var10;
  ushort uVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  uint32_t uVar14;
  wchar_t wVar15;
  uint32_t uVar16;
  int iVar17;
  monster_conflict *mon;
  object *weapon;
  object *obj;
  char *pcVar18;
  monster *pmVar19;
  player_blow *ppVar20;
  uint uVar21;
  bitflag *flags_00;
  int iVar22;
  int iVar23;
  long lVar24;
  critical_level *pcVar25;
  bool bVar26;
  source sVar27;
  source sVar28;
  wchar_t local_118;
  int local_fc;
  wchar_t s;
  wchar_t b;
  int local_dc;
  char verb [20];
  char dmg_text [20];
  char m_name [80];
  
  mon = (monster_conflict *)square_monster(cave,grid);
  weapon = equipped_item_by_slot_name(p,"weapon");
  wVar12 = chance_of_melee_hit(p,weapon,mon);
  wVar13 = terrain_armor_adjust(grid,mon->race->ac,true);
  my_strcpy(dmg_text,"",0x14);
  my_strcpy(verb,"punch",0x14);
  monster_desc(m_name,0x50,(monster *)mon,L'\x15');
  _Var7 = monster_is_visible((monster *)mon);
  if (_Var7) {
    monster_race_track(p->upkeep,mon->race);
    health_track(p->upkeep,(monster *)mon);
  }
  _Var7 = player_of_has(p,L'\x1c');
  if (_Var7) {
    equip_learn_flag(p,L'\x1c');
    msgt(0x39,"You are too afraid to attack %s!",m_name);
    return false;
  }
  local_fc = 0;
  if ((mon->m_timed[0] != 0) && (_Var7 = monster_is_visible((monster *)mon), _Var7)) {
    sVar1 = p->lev;
    _Var7 = flag_has_dbg((p->state).pflags,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
    local_fc = (int)(short)(sVar1 / 5 + 5) << _Var7;
  }
  monster_wake(mon,false,L'd');
  local_118 = 1;
  mon_clear_timed((monster *)mon,L'\x06',L'\x01');
  (mon->target).midx = L'\xffffffff';
  _Var7 = test_hit(wVar12 + local_fc,wVar13);
  if (!_Var7) {
    msgt(3,"You miss %s.",m_name);
    if (p->timed[0x31] == 0) {
      return false;
    }
    uVar14 = Rand_div(0x32);
    if (uVar14 != 0) {
      return false;
    }
    msg("You feel strange...");
    player_over_exert(p,L'\x04',L'\x14',L'\x14');
    return false;
  }
  if (weapon != (object *)0x0) {
    object_weight_one(weapon);
    my_strcpy(verb,"hit",0x14);
  }
  b = L'\0';
  s = L'\0';
  for (wVar13 = L'\x02'; (uint)wVar13 < (uint)(p->body).count; wVar13 = wVar13 + L'\x01') {
    obj = slot_object(p,wVar13);
    if (obj != (object *)0x0) {
      improve_attack_modifier(p,obj,mon,&b,&s,verb,false);
    }
  }
  if (weapon != (object *)0x0) {
    improve_attack_modifier(p,weapon,mon,&b,&s,verb,false);
  }
  improve_attack_modifier(p,(object *)0x0,mon,&b,&s,verb,false);
  flags = (p->state).pflags;
  _Var7 = flag_has_dbg(flags,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)");
  if ((_Var7) || (_Var7 = flag_has_dbg(flags,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)"), _Var7))
  {
    pmVar3 = mon->race;
    wVar13 = (p->state).to_d;
    _Var7 = flag_has_dbg(flags,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)");
    if (((_Var7) && (uVar14 = Rand_div(6), uVar14 == 0)) ||
       ((_Var7 = flag_has_dbg(flags,10,0x3d,"p->state.pflags","(PF_POWER_STRIKE)"), _Var7 &&
        (uVar14 = Rand_div(8), uVar14 == 0)))) {
      bVar8 = 1;
    }
    else {
      bVar8 = 0;
    }
    sVar1 = p->lev;
    if (wVar13 < L'\x01') {
      uVar11 = 0;
    }
    else {
      uVar11 = (ushort)""[(uint)wVar13];
    }
    uVar14 = Rand_div(100);
    iVar23 = (byte)(uVar11 / 100) + 2 + (uint)((int)uVar14 < (int)(uint)(byte)(uVar11 % 100));
    wVar13 = (int)(short)(sVar1 / 10 + 1);
    while (puVar6 = unarmed_blows, bVar26 = iVar23 != 0, iVar23 = iVar23 + -1, bVar26) {
      wVar15 = Rand_div((p->lev * 2) / 5);
      if (wVar13 <= wVar15) {
        wVar13 = wVar15 + L'\x01';
      }
    }
    wVar13 = (uint)(wVar13 < num_unarmed_blows & bVar8) + wVar13;
    if (num_unarmed_blows <= wVar13) {
      wVar13 = num_unarmed_blows;
    }
    _Var7 = flag_has_dbg(flags,10,0x4e,"p->state.pflags","(PF_HOLY_LIGHT)");
    uVar21 = 0;
    if (_Var7) {
      flags_00 = pmVar3->flags;
      _Var7 = flag_has_dbg(flags_00,0xc,0x49,"race->flags","RF_UNDEAD");
      if (_Var7) {
        uVar21 = 2;
      }
      else {
        _Var7 = flag_has_dbg(flags_00,0xc,0x4c,"race->flags","RF_HURT_LIGHT");
        uVar21 = 2;
        if (!_Var7) {
          _Var7 = flag_has_dbg(flags_00,0xc,0x48,"race->flags","RF_EVIL");
          uVar21 = (uint)_Var7;
        }
      }
    }
    iVar23 = puVar6[(long)wVar13 + -1].dd;
    iVar22 = uVar21 + puVar6[(long)wVar13 + -1].ds;
    if (bVar8 == 0) {
      local_118 = damroll(iVar23,iVar22);
LAB_001a6138:
      uVar14 = Rand_div(500);
      bVar26 = uVar14 + L'\x19' < wVar12 + local_fc;
    }
    else {
      local_118 = iVar22 * iVar23;
      uVar14 = Rand_div(3);
      if (uVar14 == 0) goto LAB_001a6138;
      bVar26 = true;
    }
    wVar12 = L'\x02';
    bVar5 = false;
  }
  else {
    if (weapon == (object *)0x0) {
      uVar21 = 10;
    }
    else {
      local_118 = (wchar_t)weapon->dd;
      uVar21 = (uint)weapon->ds * 10 + 10 >> 1;
    }
    wVar13 = L'\n';
    if (s == L'\0') {
      if (b != L'\0') {
        wVar13 = get_monster_brand_multiplier(mon,brands + b);
      }
    }
    else {
      wVar13 = slays[s].multiplier;
    }
    _Var7 = flag_has_dbg((player->state).pflags,10,0x4e,"player->state.pflags","(PF_HOLY_LIGHT)");
    if (_Var7) {
      _Var7 = flag_has_dbg(mon->race->flags,0xc,0x49,"mon->race->flags","RF_UNDEAD");
      if ((_Var7) ||
         (_Var7 = flag_has_dbg(mon->race->flags,0xc,0x4c,"mon->race->flags","RF_HURT_LIGHT"), _Var7)
         ) {
        wVar12 = wVar13 + L'\n';
      }
      else {
        _Var7 = flag_has_dbg(mon->race->flags,0xc,0x48,"mon->race->flags","RF_EVIL");
        wVar12 = wVar13;
        if (!_Var7) goto LAB_001a6224;
      }
      wVar13 = wVar12 / 10 + wVar13;
    }
LAB_001a6224:
    local_dc = uVar21 * wVar13;
    wVar12 = (p->state).to_d;
    if (weapon == (object *)0x0) {
      wVar15 = L'\0';
    }
    else {
      wVar15 = object_to_dam(weapon);
    }
    wVar15 = wVar15 + wVar12;
    if (L'\x95' < wVar15) {
      wVar15 = L'\x96';
    }
    apply_deadliness(&local_dc,wVar15);
    iVar23 = local_dc;
    uVar14 = Rand_div(10000);
    _Var7 = monster_is_obvious((monster *)mon);
    if (((_Var7) && (_Var7 = flag_has_dbg(flags,10,0x38,"p->state.pflags","(PF_ARMSMAN)"), _Var7))
       && (uVar16 = Rand_div(z_info->m_armsman_chance), uVar16 == 0)) {
      bVar5 = true;
LAB_001a6311:
      pcVar25 = z_info->m_crit_level_head;
      uVar21 = 0;
      if (pcVar25 == (critical_level *)0x0) {
        wVar12 = L'\x02';
      }
      else {
        while ((pcVar25->next != (critical_level *)0x0 &&
               (uVar16 = Rand_div(pcVar25->chance), uVar16 != 0))) {
          pcVar25 = pcVar25->next;
        }
        uVar2 = pcVar25->added_dice;
        wVar12 = pcVar25->msgt;
        if (((uVar2 != 0) &&
            (_Var7 = flag_has_dbg(flags,10,0x3f,"p->state.pflags","(PF_MANA_BURN)"), uVar21 = uVar2,
            _Var7)) && (_Var7 = monster_has_non_innate_spells((monster *)mon), _Var7)) {
          flag_on_dbg(mon->mflag,2,0xb,"mon->mflag","MFLAG_LESS_SPELL");
          iVar22 = z_info->m_manaburn_dice;
          msgt(2,"Mana Burn!");
          uVar21 = uVar2 + iVar22;
        }
      }
    }
    else {
      wVar12 = chance_of_melee_hit(p,weapon,mon);
      iVar17 = ((wVar12 + local_fc) * z_info->m_crit_power_toh_scl_num) /
               z_info->m_crit_power_toh_scl_den;
      iVar22 = z_info->m_crit_chance_power_scl_num;
      uVar16 = Rand_div(iVar17 * z_info->m_crit_chance_power_scl_den + z_info->m_crit_chance_add_den
                       );
      bVar5 = false;
      if ((int)uVar16 < iVar22 * iVar17) goto LAB_001a6311;
      wVar12 = L'\x02';
      uVar21 = 0;
    }
    iVar23 = iVar23 * 2 + -10000;
    iVar23 = damroll(uVar21 + local_118,(uint)((int)uVar14 < iVar23 % 10000) + iVar23 / 10000);
    local_118 = iVar23 + wVar13 + L'\xfffffff6';
    bVar8 = 0;
    bVar26 = false;
    wVar13 = L'\0';
  }
  _Var7 = player_of_has(p,L'\x11');
  bVar4 = L'2' < local_118;
  if (bVar4 && _Var7) {
    equip_learn_flag(p,L'\x11');
  }
  equip_learn_on_melee_attack(p);
  learn_brand_slay_from_melee(p,weapon,mon);
  _Var9 = player_is_shapechanged(p);
  if (_Var9) {
    uVar14 = Rand_div(p->shape->num_blows);
    ppVar20 = (player_blow *)&p->shape->blows;
    iVar23 = uVar14 + 1;
    do {
      ppVar20 = ppVar20->next;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    my_strcpy(verb,ppVar20->name,0x14);
  }
  if (local_118 < L'\x01') {
    my_strcpy(verb,"fail to harm",0x14);
    local_118 = L'\0';
    wVar12 = L'\x03';
  }
  if ((p->opts).opt[3] == true) {
    pcVar18 = format(" (%d)",(ulong)(uint)local_118);
    my_strcpy(dmg_text,pcVar18,0x14);
  }
  if ((weapon == (object *)0x0) &&
     ((_Var9 = flag_has_dbg(flags,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)"), _Var9 ||
      (_Var9 = flag_has_dbg(flags,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)"), _Var9)))) {
    if (bVar26) {
      if (bVar8 != 0) {
        msgt(2,"Power Strike! You attempt to confuse %s%s.",m_name,dmg_text);
        goto LAB_001a6700;
      }
      pcVar18 = "You %s and attempt to confuse %s%s.";
    }
    else if (bVar8 == 0) {
      pcVar18 = "You %s %s%s.";
    }
    else {
      pcVar18 = "Power Strike! You %s %s%s.";
    }
    msgt(2,pcVar18,unarmed_blows[(long)wVar13 + -1].name,m_name,dmg_text);
  }
  else {
    for (lVar24 = 8; lVar24 != 0x78; lVar24 = lVar24 + 0x10) {
      if (wVar12 == *(wchar_t *)((long)&options[0x2b].type + lVar24)) {
        if ((local_fc == 0) || (_Var9 = monster_is_visible((monster *)mon), !_Var9)) {
          pcVar18 = "Armsman hit!";
          if (bVar5) goto LAB_001a65e9;
        }
        else {
          _Var9 = flag_has_dbg(flags,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
          pcVar18 = "You rudely awaken the monster.";
          if ((uint)(wVar12 + L'\xffffff6d') < 2) {
            pcVar18 = "You ruthlessly sneak attack!";
          }
          if (!_Var9) {
            pcVar18 = "You rudely awaken the monster.";
          }
LAB_001a65e9:
          msgt(2,pcVar18);
        }
        if (*(long *)((long)&melee_hit_types[0].msg_type + lVar24) == 0) {
          msgt(wVar12,"You %s %s%s.",verb,m_name,dmg_text);
        }
        else {
          msgt(wVar12,"You %s %s%s. %s",verb,m_name,dmg_text);
        }
      }
    }
  }
LAB_001a6700:
  _Var9 = flag_has_dbg(flags,10,0x4a,"p->state.pflags","(PF_FURY)");
  if (_Var9) {
    fury_boost(p);
  }
  if (p->timed[0x27] != 0) {
    player_clear_timed(p,L'\'',true,false);
    uVar14 = Rand_div((int)p->lev);
    mon_inc_timed((monster *)mon,L'\x02',(int)uVar14 / 10 + L'\n',L'\x01');
  }
  wVar12 = (int)mon->hp;
  if (local_118 < mon->hp) {
    wVar12 = local_118;
  }
  _Var9 = mon_take_hit(mon,p,local_118,fear,(char *)0x0);
  if ((p->timed[0x31] != 0) && (uVar14 = Rand_div(0x32), uVar14 == 0)) {
    msg("You feel something give way!");
    player_over_exert(p,L'\x01',L'\x14',L'\0');
  }
  if (_Var9) {
    *fear = false;
  }
  else if ((p->timed[0x2a] != 0) && (_Var10 = monster_is_living((monster *)mon), _Var10)) {
    sVar27 = source_player();
    sVar28.which = sVar27.which;
    pcVar18 = format("%d",(ulong)(uint)wVar12);
    sVar28._4_4_ = 0;
    sVar28.what = sVar27.what;
    effect_simple(L'\x03',sVar28,pcVar18,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  if (bVar4 && _Var7) {
    sVar28 = source_player();
    sVar27.which = sVar28.which;
    sVar27._4_4_ = 0;
    sVar27.what = sVar28.what;
    effect_simple(L'A',sVar27,"0",L'\0',L'\n',L'\0',L'\0',L'\0',(_Bool *)0x0);
    pmVar19 = square_monster(cave,grid);
    if (pmVar19 == (monster *)0x0) {
      _Var9 = true;
    }
  }
  return _Var9;
}

Assistant:

bool py_attack_real(struct player *p, struct loc grid, bool *fear)
{
	size_t i;

	/* Information about the target of the attack */
	struct monster *mon = square_monster(cave, grid);
	char m_name[80];
	bool stop = false;

	/* The weapon used */
	struct object *obj = equipped_item_by_slot_name(p, "weapon");

	/* Information about the attack */
	int chance = chance_of_melee_hit(p, obj, mon);
	int drain = 0;
	int splash = 0;
	bool do_quake = false;
	bool success = false;
	bool armsman = false;
	bool power_strike = false;
	bool confusing_blow = false;
	int unarmed_blow_idx = 0;

	/* Bonus to attack if monster is sleeping. */
	int sleeping_bonus = 0;

	int ac = terrain_armor_adjust(grid, mon->race->ac, true);

	char verb[20];
	uint32_t msg_type = MSG_HIT;
	char dmg_text[20];
	int j, b, s, weight, dmg;

	my_strcpy(dmg_text, "", sizeof(dmg_text));

	/* Default to punching */
	my_strcpy(verb, "punch", sizeof(verb));

	/* Extract monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	/* Auto-Recall and track if possible and visible */
	if (monster_is_visible(mon)) {
		monster_race_track(p->upkeep, mon->race);
		health_track(p->upkeep, mon);
	}

	/* Handle player fear (only for invisible monsters) */
	if (player_of_has(p, OF_AFRAID)) {
		equip_learn_flag(p, OF_AFRAID);
		msgt(MSG_AFRAID, "You are too afraid to attack %s!", m_name);
		return false;
	}

	/* If the monster is sleeping and visible, it can be hit more easily. */
	if (mon->m_timed[MON_TMD_SLEEP] && monster_is_visible(mon)) {
		sleeping_bonus = 5 + p->lev / 5;
		if (player_has(p, PF_BACKSTAB)) {
			sleeping_bonus *= 2;
		}
	}

	/* Disturb the monster */
	monster_wake(mon, false, 100);
	mon_clear_timed(mon, MON_TMD_HOLD, MON_TMD_FLG_NOTIFY);

	/* Become hostile */
	mon->target.midx = -1;

	/* See if the player hit */
	success = test_hit(chance + sleeping_bonus, ac);

	/* If a miss, skip this hit */
	if (!success) {
		msgt(MSG_MISS, "You miss %s.", m_name);

		/* Small chance of bloodlust side-effects */
		if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
			msg("You feel strange...");
			player_over_exert(p, PY_EXERT_SCRAMBLE, 20, 20);
		}

		return false;
	}

	if (obj) {
		/* Handle normal weapon */
		weight = object_weight_one(obj);
		my_strcpy(verb, "hit", sizeof(verb));
	} else {
		weight = 0;
	}

	/* Best attack from all slays or brands on all non-launcher equipment */
	b = 0;
	s = 0;
	for (j = 2; j < p->body.count; j++) {
		struct object *obj_local = slot_object(p, j);
		if (obj_local) {
			improve_attack_modifier(p, obj_local, mon, &b, &s, verb, false);
		}
	}

	/* Get the best attack from all slays or brands - weapon or temporary */
	if (obj) {
		improve_attack_modifier(p, obj, mon, &b, &s, verb, false);
	}
	improve_attack_modifier(p, NULL, mon, &b, &s, verb, false);

	if (player_has(p, PF_UNARMED_COMBAT) || player_has(p, PF_MARTIAL_ARTS)) {
		dmg = unarmed_damage(p, mon->race, chance + sleeping_bonus,
							 &unarmed_blow_idx, &power_strike, &confusing_blow);
	} else {
		/* Get the damage */
		dmg = melee_damage(p, mon, obj, b, s, sleeping_bonus, &msg_type,
						   &armsman);
	}

	/* Splash damage and earthquakes */
	splash = (weight * dmg) / 100;
	if (player_of_has(p, OF_IMPACT) && dmg > 50) {
		do_quake = true;
		equip_learn_flag(p, OF_IMPACT);
	}

	/* Learn by use */
	equip_learn_on_melee_attack(p);
	learn_brand_slay_from_melee(p, obj, mon);

	/* Substitute shape-specific blows for shapechanged players */
	if (player_is_shapechanged(p)) {
		int choice = randint0(p->shape->num_blows);
		struct player_blow *blow = p->shape->blows;
		while (choice--) {
			blow = blow->next;
		}
		my_strcpy(verb, blow->name, sizeof(verb));
	}

	/* No negative damage; change verb if no damage done */
	if (dmg <= 0) {
		dmg = 0;
		msg_type = MSG_MISS;
		my_strcpy(verb, "fail to harm", sizeof(verb));
	}

	/* Set damage value text if needed */
	if (OPT(p, show_damage)) {
		my_strcpy(dmg_text, format(" (%d)", dmg), sizeof(dmg_text));
	}

	/* Special messages for unarmed combat */
	if (!obj && (player_has(p, PF_UNARMED_COMBAT) ||
				 player_has(p, PF_MARTIAL_ARTS))) {
		const char *name = unarmed_blows[unarmed_blow_idx - 1].name;

		/* Display the attack message, feedback for relevant specialties */
		if (confusing_blow) {
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You attempt to confuse %s%s.",
					 m_name, dmg_text);
			} else {
				msgt(MSG_HIT, "You %s and attempt to confuse %s%s.",
					 name, m_name, dmg_text);
			}
		} else {
			/* Basic attack message. */
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You %s %s%s.", name, m_name,
					 dmg_text);
			} else {
				msgt(MSG_HIT, "You %s %s%s.", name, m_name, dmg_text);
			}
		}
	} else {
		for (i = 0; i < N_ELEMENTS(melee_hit_types); i++) {
			if (msg_type != melee_hit_types[i].msg_type) continue;

			/* Encourage the player to beat on sleeping monsters. */
			if (sleeping_bonus && monster_is_visible(mon)) {
				/* More "interesting" messages if we get a seriously good hit */
				if (player_has(p, PF_BACKSTAB) &&
					((msg_type == MSG_HIT_HI_GREAT)
					 || (msg_type == MSG_HIT_HI_SUPERB))) {
					msgt(MSG_HIT, "You ruthlessly sneak attack!");
				} else {
					/* Standard "wakeup call". */
					msgt(MSG_HIT, "You rudely awaken the monster.");
				}
			} else if (armsman) {
				/* Credit where credit is due, if no special message already */
				msgt(MSG_HIT, "Armsman hit!");
			}

			if (melee_hit_types[i].text)
				msgt(msg_type, "You %s %s%s. %s", verb, m_name, dmg_text,
					 melee_hit_types[i].text);
			else
				msgt(msg_type, "You %s %s%s.", verb, m_name, dmg_text);
		}
	}

	/* Specialty ability Fury */
	if (player_has(p, PF_FURY)) {
		fury_boost(p);
	}

	/* Pre-damage side effects */
	blow_side_effects(p, mon);

	/* Damage, check for hp drain, fear and death */
	drain = MIN(mon->hp, dmg);
	stop = mon_take_hit(mon, p, dmg, fear, NULL);

	/* Small chance of bloodlust side-effects */
	if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
		msg("You feel something give way!");
		player_over_exert(p, PY_EXERT_CON, 20, 0);
	}

	if (!stop) {
		if (p->timed[TMD_ATT_VAMP] && monster_is_living(mon)) {
			effect_simple(EF_HEAL_HP, source_player(), format("%d", drain),
						  0, 0, 0, 0, 0, NULL);
		}
	}

	if (stop)
		(*fear) = false;

	/* Post-damage effects */
	if (blow_after_effects(grid, dmg, splash, fear, do_quake))
		stop = true;

	return stop;
}